

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d.cpp
# Opt level: O0

int ncnn::convolution1d(Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
                       int stride_w,int dilation_w,int activation_type,Mat *activation_params,
                       Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  float *pfVar6;
  float *pfVar7;
  Mat *in_RCX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  Mat *in_RSI;
  Mat *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int in_stack_00000008;
  undefined4 in_stack_00000010;
  float wt;
  float val;
  int k;
  float *sptr;
  int q;
  float *kptr;
  float sum;
  int j;
  float *outptr;
  int p;
  int bias_term;
  int outh;
  int outw;
  int h;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  float local_b4;
  Mat *in_stack_ffffffffffffff50;
  int local_9c;
  float *local_98;
  int local_8c;
  float *local_88;
  float local_80;
  int local_7c;
  int local_6c;
  float local_4;
  undefined8 extraout_XMM0_Qb;
  
  iVar2 = in_RDI->h;
  iVar3 = in_RSI->w;
  iVar4 = in_RSI->h;
  bVar5 = Mat::empty(in_stack_ffffffffffffff50);
  for (local_6c = 0; local_6c < iVar4; local_6c = local_6c + 1) {
    pfVar6 = Mat::row(in_RSI,local_6c);
    for (local_7c = 0; local_7c < iVar3; local_7c = local_7c + 1) {
      local_80 = 0.0;
      if (!bVar5) {
        pfVar7 = Mat::operator[](in_RCX,(long)local_6c);
        local_80 = *pfVar7;
      }
      local_88 = Mat::operator_cast_to_float_((Mat *)CONCAT71(in_register_00000011,in_DL));
      local_88 = local_88 + in_R8D * iVar2 * local_6c;
      for (local_8c = 0; local_8c < iVar2; local_8c = local_8c + 1) {
        local_98 = Mat::row(in_RDI,local_8c);
        local_98 = local_98 + local_7c * in_R9D;
        for (local_9c = 0; local_9c < in_R8D; local_9c = local_9c + 1) {
          local_80 = *local_98 * local_88[local_9c] + local_80;
          local_98 = local_98 + in_stack_00000008;
        }
        local_88 = local_88 + in_R8D;
      }
      local_4 = local_80;
      switch(in_stack_00000010) {
      case 1:
        dVar9 = std::fmax((double)(ulong)(uint)local_80,0.0);
        local_4 = SUB84(dVar9,0);
        break;
      case 2:
        pfVar7 = Mat::operator[](_val,0);
        if (local_80 <= 0.0) {
          local_b4 = local_80 * *pfVar7;
        }
        else {
          local_b4 = local_80;
        }
        local_4 = local_b4;
        break;
      case 3:
        pfVar7 = Mat::operator[](_val,0);
        fVar1 = *pfVar7;
        pfVar7 = Mat::operator[](_val,1);
        if (local_80 < fVar1) {
          local_4 = fVar1;
        }
        if (*pfVar7 < local_4) {
          local_4 = *pfVar7;
        }
        break;
      case 4:
        dVar9 = std::exp((double)(ulong)(uint)-local_80);
        local_4 = 1.0 / (SUB84(dVar9,0) + 1.0);
        break;
      case 5:
        auVar10._0_8_ = std::exp((double)(ulong)(uint)local_80);
        auVar10._8_8_ = extraout_XMM0_Qb;
        auVar11._4_12_ = auVar10._4_12_;
        auVar11._0_4_ = SUB84(auVar10._0_8_,0) + 1.0;
        dVar9 = std::log(auVar11._0_8_);
        dVar9 = std::tanh(dVar9);
        local_4 = local_80 * SUB84(dVar9,0);
        break;
      case 6:
        pfVar7 = Mat::operator[](_val,0);
        fVar1 = *pfVar7;
        pfVar7 = Mat::operator[](_val,1);
        fVar8 = -*pfVar7 / fVar1;
        if (fVar8 <= local_80) {
          if (local_80 <= 1.0 / fVar1 + fVar8) {
            local_4 = local_80 * (local_80 * fVar1 + *pfVar7);
          }
        }
        else {
          local_4 = 0.0;
        }
      }
      pfVar6[local_7c] = local_4;
    }
  }
  return 0;
}

Assistant:

static int convolution1d(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int stride_w, int dilation_w, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int h = bottom_blob.h;

    const int outw = top_blob.w;
    const int outh = top_blob.h;

    const int bias_term = bias_data.empty() ? 0 : 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outh; p++)
    {
        float* outptr = top_blob.row(p);

        for (int j = 0; j < outw; j++)
        {
            float sum = 0.f;

            if (bias_term)
                sum = bias_data[p];

            const float* kptr = (const float*)weight_data + kernel_w * h * p;

            for (int q = 0; q < h; q++)
            {
                const float* sptr = bottom_blob.row(q) + j * stride_w;

                for (int k = 0; k < kernel_w; k++)
                {
                    float val = *sptr;
                    float wt = kptr[k];
                    sum += val * wt;

                    sptr += dilation_w;
                }

                kptr += kernel_w;
            }

            sum = activation_ss(sum, activation_type, activation_params);

            outptr[j] = sum;
        }
    }

    return 0;
}